

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::load(Dictionary *this,istream *in)

{
  string_view w;
  undefined4 uVar1;
  int iVar2;
  int32_t iVar3;
  mapped_type *pmVar4;
  reference this_00;
  reference pvVar5;
  Dictionary *this_01;
  char *in_RSI;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *in_RDI;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 uVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  int32_t i_2;
  int32_t word2intsize;
  int32_t second;
  int32_t first;
  int32_t i_1;
  entry e;
  char c;
  int32_t i;
  key_type *in_stack_ffffffffffffff48;
  pointer *this_02;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  mapped_type mVar9;
  Dictionary *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int iVar10;
  int iVar11;
  mapped_type local_78;
  undefined1 local_74 [4];
  int local_70;
  undefined1 local_60 [16];
  Dictionary *in_stack_ffffffffffffffb0;
  undefined1 local_40 [8];
  undefined1 local_38 [35];
  char local_15;
  int local_14;
  char *local_10;
  
  local_10 = in_RSI;
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::clear
            ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)0x186c2d);
  std::istream::read(local_10,(long)&in_RDI[3].
                                     super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::istream::read(local_10,(long)((long)&in_RDI[3].
                                            super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
  ;
  std::istream::read(local_10,(long)(in_RDI + 4));
  std::istream::read(local_10,(long)&in_RDI[4].
                                     super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
  std::istream::read(local_10,(long)&in_RDI[4].
                                     super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar7 = extraout_XMM0_Qb;
  for (local_14 = 0;
      local_14 <
      *(int *)&in_RDI[3].super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage; local_14 = local_14 + 1) {
    entry::entry((entry *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    while( true ) {
      uVar1 = std::istream::get();
      local_15 = (char)uVar1;
      if (local_15 == '\0') break;
      std::__cxx11::string::push_back((char)local_60);
    }
    std::istream::read(local_10,(long)local_40);
    std::istream::read(local_10,(long)local_38);
    uVar7 = extraout_XMM0_Qb_00;
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::push_back
              (in_RDI,(value_type *)CONCAT44(uVar1,in_stack_ffffffffffffff58));
    entry::~entry((entry *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)0x186daf);
  for (local_70 = 0;
      (long)local_70 <
      (long)in_RDI[4].super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage; local_70 = local_70 + 1) {
    std::istream::read(local_10,(long)local_74);
    std::istream::read(local_10,(long)&local_78);
    uVar7 = extraout_XMM0_Qb_01;
    mVar9 = local_78;
    pmVar4 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          in_stack_ffffffffffffff48);
    *pmVar4 = mVar9;
  }
  initTableDiscard(in_stack_ffffffffffffff70);
  initNgrams(in_stack_ffffffffffffffb0);
  auVar6._0_8_ = (double)*(int *)&in_RDI[3].
                                  super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar6._8_8_ = uVar7;
  auVar8._0_8_ = auVar6._0_8_ / 0.7;
  auVar8._8_8_ = uVar7;
  auVar6 = vroundsd_avx(auVar6,auVar8,10);
  iVar2 = (int)auVar6._0_8_;
  uVar1 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (size_type)in_stack_ffffffffffffff48,(value_type_conflict1 *)0x186e76);
  iVar10 = 0;
  while (iVar10 < *(int *)&in_RDI[3].
                           super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_02 = &(in_RDI->super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>).
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar11 = iVar10;
    this_00 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                        ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
                         &in_RDI[1].
                          super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar10);
    std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    w._M_len._4_4_ = iVar11;
    w._M_len._0_4_ = in_stack_ffffffffffffff78;
    w._M_str._0_4_ = uVar1;
    w._M_str._4_4_ = iVar2;
    iVar3 = find(this_01,w);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)this_02,(long)iVar3);
    *pvVar5 = iVar10;
    iVar10 = iVar11 + 1;
  }
  return;
}

Assistant:

void Dictionary::load(std::istream& in) {
  words_.clear();
  in.read((char*)&size_, sizeof(int32_t));
  in.read((char*)&nwords_, sizeof(int32_t));
  in.read((char*)&nlabels_, sizeof(int32_t));
  in.read((char*)&ntokens_, sizeof(int64_t));
  in.read((char*)&pruneidx_size_, sizeof(int64_t));
  for (int32_t i = 0; i < size_; i++) {
    char c;
    entry e;
    while ((c = in.get()) != 0) {
      e.word.push_back(c);
    }
    in.read((char*)&e.count, sizeof(int64_t));
    in.read((char*)&e.type, sizeof(entry_type));
    words_.push_back(e);
  }
  pruneidx_.clear();
  for (int32_t i = 0; i < pruneidx_size_; i++) {
    int32_t first;
    int32_t second;
    in.read((char*)&first, sizeof(int32_t));
    in.read((char*)&second, sizeof(int32_t));
    pruneidx_[first] = second;
  }
  initTableDiscard();
  initNgrams();

  int32_t word2intsize = std::ceil(size_ / 0.7);
  word2int_.assign(word2intsize, -1);
  for (int32_t i = 0; i < size_; i++) {
    word2int_[find(words_[i].word)] = i;
  }
}